

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intFrames.c
# Opt level: O1

Aig_Man_t * Inter_ManFramesInter(Aig_Man_t *pAig,int nFrames,int fAddRegOuts,int fUseTwoFrames)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  Aig_Obj_t *p1;
  uint uVar9;
  Aig_Obj_t *pAVar10;
  long lVar11;
  
  if (pAig->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/int/intFrames.c"
                  ,0x35,"Aig_Man_t *Inter_ManFramesInter(Aig_Man_t *, int, int, int)");
  }
  if (pAig->nTruePos - pAig->nConstrs != 1) {
    __assert_fail("Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/int/intFrames.c"
                  ,0x36,"Aig_Man_t *Inter_ManFramesInter(Aig_Man_t *, int, int, int)");
  }
  p = Aig_ManStart((pAig->nObjs[6] + pAig->nObjs[5]) * nFrames);
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  if (fAddRegOuts == 0) {
    if (0 < pAig->nRegs) {
      iVar2 = 0;
      do {
        uVar8 = pAig->nTruePis + iVar2;
        if (((int)uVar8 < 0) || (pAig->vCis->nSize <= (int)uVar8)) goto LAB_005bdffb;
        pvVar1 = pAig->vCis->pArray[uVar8];
        pAVar10 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar10;
        iVar2 = iVar2 + 1;
      } while (iVar2 < pAig->nRegs);
    }
  }
  else if (0 < pAig->nRegs) {
    iVar2 = 0;
    do {
      uVar8 = pAig->nTruePis + iVar2;
      if (((int)uVar8 < 0) || (pAig->vCis->nSize <= (int)uVar8)) goto LAB_005bdffb;
      *(ulong *)((long)pAig->vCis->pArray[uVar8] + 0x28) = (ulong)p->pConst1 ^ 1;
      iVar2 = iVar2 + 1;
    } while (iVar2 < pAig->nRegs);
  }
  iVar2 = 0;
  if (nFrames < 1) {
    pAVar10 = (Aig_Obj_t *)0x0;
LAB_005bdf00:
    if (fAddRegOuts == 0) {
      if (pAig->vCos->nSize < 1) goto LAB_005bdffb;
      pvVar1 = *pAig->vCos->pArray;
      if ((fUseTwoFrames == 0) || (pAVar10 == (Aig_Obj_t *)0x0)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_005be01a;
        uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar10 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar10 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
      }
      else {
        if (((ulong)pvVar1 & 1) != 0) {
LAB_005be01a:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        pAVar10 = Aig_Or(p,pAVar10,pAVar4);
      }
      Aig_ObjCreateCo(p,pAVar10);
    }
    else if (0 < pAig->nRegs) {
      iVar2 = 0;
      do {
        uVar8 = pAig->nTruePos + iVar2;
        if (((int)uVar8 < 0) || (pAig->vCos->nSize <= (int)uVar8)) goto LAB_005bdffb;
        pvVar1 = pAig->vCos->pArray[uVar8];
        if (((ulong)pvVar1 & 1) != 0) goto LAB_005be01a;
        uVar6 = *(ulong *)((long)pvVar1 + 8);
        uVar7 = uVar6 & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar10 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar10 = (Aig_Obj_t *)((ulong)((uint)uVar6 & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        Aig_ObjCreateCo(p,pAVar10);
        iVar2 = iVar2 + 1;
      } while (iVar2 < pAig->nRegs);
    }
    Aig_ManCleanup(p);
    return p;
  }
  pAVar10 = (Aig_Obj_t *)0x0;
  while( true ) {
    if (0 < pAig->nTruePis) {
      lVar11 = 0;
      do {
        if (pAig->vCis->nSize <= lVar11) goto LAB_005bdffb;
        pvVar1 = pAig->vCis->pArray[lVar11];
        pAVar4 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
        lVar11 = lVar11 + 1;
      } while (lVar11 < pAig->nTruePis);
    }
    pVVar5 = pAig->vObjs;
    if (0 < pVVar5->nSize) {
      lVar11 = 0;
      do {
        pvVar1 = pVVar5->pArray[lVar11];
        if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
          if (((ulong)pvVar1 & 1) != 0) goto LAB_005be01a;
          uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
          if (uVar6 == 0) {
            pAVar4 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar4 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
          }
          uVar6 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
          if (uVar6 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x28));
          }
          pAVar4 = Aig_And(p,pAVar4,p1);
          *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
        }
        lVar11 = lVar11 + 1;
        pVVar5 = pAig->vObjs;
      } while (lVar11 < pVVar5->nSize);
    }
    uVar6 = (ulong)(uint)pAig->nTruePos;
    if (0 < pAig->nTruePos) {
      lVar11 = 0;
      do {
        if (pAig->vCos->nSize <= lVar11) goto LAB_005bdffb;
        if ((long)(int)uVar6 - (long)pAig->nConstrs <= lVar11) {
          pvVar1 = pAig->vCos->pArray[lVar11];
          if (((ulong)pvVar1 & 1) != 0) goto LAB_005be01a;
          uVar6 = *(ulong *)((long)pvVar1 + 8);
          uVar7 = uVar6 & 0xfffffffffffffffe;
          if (uVar7 == 0) {
            pAVar4 = (Aig_Obj_t *)0x1;
          }
          else {
            pAVar4 = (Aig_Obj_t *)((ulong)((uint)uVar6 & 1) ^ *(ulong *)(uVar7 + 0x28) ^ 1);
          }
          Aig_ObjCreateCo(p,pAVar4);
        }
        lVar11 = lVar11 + 1;
        uVar6 = (ulong)pAig->nTruePos;
      } while (lVar11 < (long)uVar6);
    }
    if (iVar2 == nFrames + -1) goto LAB_005bdf00;
    if (pAig->vCos->nSize < 1) break;
    pvVar1 = *pAig->vCos->pArray;
    if (((ulong)pvVar1 & 1) != 0) goto LAB_005be01a;
    uVar6 = *(ulong *)((long)pvVar1 + 8);
    uVar7 = uVar6 & 0xfffffffffffffffe;
    if (uVar7 == 0) {
      pAVar10 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar10 = (Aig_Obj_t *)((ulong)((uint)uVar6 & 1) ^ *(ulong *)(uVar7 + 0x28));
    }
    if (0 < pAig->nRegs) {
      iVar3 = 0;
      do {
        uVar8 = pAig->nTruePos + iVar3;
        if (((int)uVar8 < 0) || (pAig->vCos->nSize <= (int)uVar8)) goto LAB_005bdffb;
        pvVar1 = pAig->vCos->pArray[uVar8];
        if (((ulong)pvVar1 & 1) != 0) goto LAB_005be01a;
        uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          uVar6 = 0;
        }
        else {
          uVar6 = (ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28);
        }
        *(ulong *)((long)pvVar1 + 0x28) = uVar6;
        iVar3 = iVar3 + 1;
      } while (iVar3 < pAig->nRegs);
    }
    if (0 < pAig->nRegs) {
      iVar3 = 0;
      do {
        uVar8 = pAig->nTruePos + iVar3;
        if (((((int)uVar8 < 0) || (pAig->vCos->nSize <= (int)uVar8)) ||
            (uVar9 = pAig->nTruePis + iVar3, (int)uVar9 < 0)) || (pAig->vCis->nSize <= (int)uVar9))
        goto LAB_005bdffb;
        *(undefined8 *)((long)pAig->vCis->pArray[uVar9] + 0x28) =
             *(undefined8 *)((long)pAig->vCos->pArray[uVar8] + 0x28);
        iVar3 = iVar3 + 1;
      } while (iVar3 < pAig->nRegs);
    }
    iVar2 = iVar2 + 1;
  }
LAB_005bdffb:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Create timeframes of the manager for interpolation.]

  Description [The resulting manager is combinational. The primary inputs
  corresponding to register outputs are ordered first. The only POs of the 
  manager is the property output of the last timeframe.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Inter_ManFramesInter( Aig_Man_t * pAig, int nFrames, int fAddRegOuts, int fUseTwoFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    Aig_Obj_t * pLastPo = NULL;
    int i, f;
    assert( Saig_ManRegNum(pAig) > 0 );
    assert( Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) == 1 );
    pFrames = Aig_ManStart( Aig_ManNodeNum(pAig) * nFrames );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pFrames );
    // create variables for register outputs
    if ( fAddRegOuts )
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->pData = Aig_ManConst0( pFrames );
    }
    else
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi( pFrames );
    }
    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // create PI nodes for this frame
        Saig_ManForEachPi( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi( pFrames );
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
            pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        // add outputs for constraints
        Saig_ManForEachPo( pAig, pObj, i )
        {
            if ( i < Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) )
                continue;
            Aig_ObjCreateCo( pFrames, Aig_Not( Aig_ObjChild0Copy(pObj) ) );
        }
        if ( f == nFrames - 1 )
            break;
        // remember the last PO
        pObj = Aig_ManCo( pAig, 0 );
        pLastPo = Aig_ObjChild0Copy(pObj);
        // save register inputs
        Saig_ManForEachLi( pAig, pObj, i )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        // transfer to register outputs
        Saig_ManForEachLiLo(  pAig, pObjLi, pObjLo, i )
            pObjLo->pData = pObjLi->pData;
    }
    // create POs for each register output
    if ( fAddRegOuts )
    {
        Saig_ManForEachLi( pAig, pObj, i )
            Aig_ObjCreateCo( pFrames, Aig_ObjChild0Copy(pObj) );
    }
    // create the only PO of the manager
    else
    {
        pObj = Aig_ManCo( pAig, 0 );
        // add the last PO
        if ( pLastPo == NULL || !fUseTwoFrames )
            pLastPo = Aig_ObjChild0Copy(pObj);
        else
            pLastPo = Aig_Or( pFrames, pLastPo, Aig_ObjChild0Copy(pObj) );
        Aig_ObjCreateCo( pFrames, pLastPo );
    }
    Aig_ManCleanup( pFrames );
    return pFrames;
}